

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall Compiler::writeSymTab(Compiler *this)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  Function **f;
  _Hash_node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string fileName;
  ofstream stream;
  
  extractFileName_abi_cxx11_(&fileName,this);
  std::operator+(&local_290,"Output/",&fileName);
  std::operator+(&local_270,&local_290,"_symtab.txt");
  std::ofstream::ofstream(&stream,(string *)&local_270,_S_out);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  p_Var3 = &(this->symTabGenerator->symbolTable->classes)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    poVar2 = operator<<((ostream *)&stream,(Class *)p_Var3[5]._M_nxt);
    std::operator<<(poVar2,"\n");
  }
  p_Var4 = &(this->symTabGenerator->symbolTable->freeFunctions)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    p_Var1 = p_Var4[6]._M_nxt;
    for (p_Var5 = p_Var4[5]._M_nxt; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
      poVar2 = operator<<((ostream *)&stream,(Function *)p_Var5->_M_nxt);
      std::operator<<(poVar2,"\n");
    }
  }
  poVar2 = operator<<((ostream *)&stream,this->symTabGenerator->symbolTable->main);
  std::operator<<(poVar2,"\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&stream);
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

void Compiler::writeSymTab() {
    std::string fileName = extractFileName();
    std::ofstream stream("Output/" + fileName + "_symtab.txt");
    for (const auto &c : symTabGenerator->symbolTable->classes) stream << *c.second << "\n";

    for (const auto &functions : symTabGenerator->symbolTable->freeFunctions) {
        for (const auto &f : functions.second) stream << *f << "\n";
    }

    stream << *(symTabGenerator->symbolTable->main) << "\n";

    stream.close();
}